

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmAndiEa<(moira::Instr)7,(moira::Mode)2,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  Imu<4> im;
  StrWriter *pSVar2;
  Ea<(moira::Mode)2,_4> dst;
  u32 local_34;
  ushort local_30;
  
  im.raw = dasmIncRead<4>(this,addr);
  local_30 = op & 7;
  local_34 = *addr;
  SVar1 = str->style->syntax;
  pSVar2 = StrWriter::operator<<(str);
  pSVar2 = StrWriter::operator<<(pSVar2);
  StrWriter::operator<<(pSVar2,(Tab)(str->tab).raw);
  if (SVar1 == MUSASHI) {
    pSVar2 = StrWriter::operator<<(pSVar2,im);
    StrWriter::operator<<(pSVar2);
  }
  else {
    pSVar2 = StrWriter::operator<<(pSVar2,(Ims<4>)im.raw);
    StrWriter::operator<<(pSVar2,",");
  }
  StrWriter::operator<<(pSVar2,(Ea<(moira::Mode)2,_4> *)&local_34);
  return;
}

Assistant:

void
Moira::dasmAndiEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = dasmIncRead<S>(addr);
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    if (str.style.syntax == Syntax::MUSASHI) {
        str << Ins<I>{} << Sz<S>{} << str.tab << Imu<S>{src} << Sep{} << dst;
    } else {
        str << Ins<I>{} << Sz<S>{} << str.tab << Ims<S>(src) << "," << dst;
    }
}